

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  jpeg_component_info *pjVar5;
  uint uVar6;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *st_00;
  int iVar7;
  int *natural_order;
  int m;
  int v2;
  int v;
  int ke;
  int k;
  int tbl;
  int ci;
  int blkn;
  uchar *st;
  JBLOCKROW block;
  jpeg_component_info *compptr;
  arith_entropy_ptr entropy;
  JBLOCKROW *MCU_data_local;
  j_compress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar2[4].start_pass == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      *(uint *)&pjVar2[4].start_pass = cinfo->restart_interval;
      *(int *)((long)&pjVar2[4].start_pass + 4) = *(int *)((long)&pjVar2[4].start_pass + 4) + 1;
      *(uint *)((long)&pjVar2[4].start_pass + 4) = *(uint *)((long)&pjVar2[4].start_pass + 4) & 7;
    }
    *(int *)&pjVar2[4].start_pass = *(int *)&pjVar2[4].start_pass + -1;
  }
  piVar3 = cinfo->natural_order;
  tbl = 0;
  do {
    if (cinfo->blocks_in_MCU <= tbl) {
      return 1;
    }
    paJVar4 = MCU_data[tbl];
    iVar1 = cinfo->MCU_membership[tbl];
    pjVar5 = cinfo->cur_comp_info[iVar1];
    iVar7 = pjVar5->dc_tbl_no;
    st_00 = (&pjVar2[4].encode_mcu)[iVar7] + *(int *)((long)&pjVar2[3].encode_mcu + (long)iVar1 * 4)
    ;
    m = (int)(*paJVar4)[0] - *(int *)((long)&pjVar2[2].finish_pass + (long)iVar1 * 4);
    if (m == 0) {
      arith_encode(cinfo,(uchar *)st_00,0);
      *(undefined4 *)((long)&pjVar2[3].encode_mcu + (long)iVar1 * 4) = 0;
    }
    else {
      *(int *)((long)&pjVar2[2].finish_pass + (long)iVar1 * 4) = (int)(*paJVar4)[0];
      arith_encode(cinfo,(uchar *)st_00,1);
      if (m < 1) {
        m = -m;
        arith_encode(cinfo,(uchar *)(st_00 + 1),1);
        _ci = (_func_void_j_compress_ptr *)(st_00 + 3);
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + (long)iVar1 * 4) = 8;
      }
      else {
        arith_encode(cinfo,(uchar *)(st_00 + 1),0);
        _ci = (_func_void_j_compress_ptr *)(st_00 + 2);
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + (long)iVar1 * 4) = 4;
      }
      natural_order._0_4_ = 0;
      uVar6 = m - 1;
      if (uVar6 != 0) {
        arith_encode(cinfo,(uchar *)_ci,1);
        natural_order._0_4_ = 1;
        _ci = (_func_void_j_compress_ptr *)((&pjVar2[4].encode_mcu)[iVar7] + 0x14);
        natural_order._4_4_ = uVar6;
        while (natural_order._4_4_ = (int)natural_order._4_4_ >> 1, natural_order._4_4_ != 0) {
          arith_encode(cinfo,(uchar *)_ci,1);
          natural_order._0_4_ = (uint)natural_order << 1;
          _ci = _ci + 1;
        }
      }
      arith_encode(cinfo,(uchar *)_ci,0);
      if ((int)(uint)natural_order < (int)((1L << (cinfo->arith_dc_L[iVar7] & 0x3f)) >> 1)) {
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + (long)iVar1 * 4) = 0;
      }
      else if ((int)((1L << (cinfo->arith_dc_U[iVar7] & 0x3f)) >> 1) < (int)(uint)natural_order) {
        *(int *)((long)&pjVar2[3].encode_mcu + (long)iVar1 * 4) =
             *(int *)((long)&pjVar2[3].encode_mcu + (long)iVar1 * 4) + 8;
      }
      while (natural_order._0_4_ = (int)(uint)natural_order >> 1, (uint)natural_order != 0) {
        arith_encode(cinfo,(uchar *)(_ci + 0xe),(uint)(((uint)natural_order & uVar6) != 0));
      }
    }
    v2 = cinfo->lim_Se;
    if (v2 != 0) {
      iVar1 = pjVar5->ac_tbl_no;
      do {
        if ((*paJVar4)[piVar3[v2]] != 0) break;
        v2 = v2 + -1;
      } while (v2 != 0);
      v = 0;
      while (v < v2) {
        _ci = (&pjVar2[9].finish_pass)[iVar1] + v * 3;
        arith_encode(cinfo,(uchar *)_ci,0);
        while( true ) {
          v = v + 1;
          m = (int)(*paJVar4)[piVar3[v]];
          if (m != 0) break;
          arith_encode(cinfo,(uchar *)(_ci + 1),0);
          _ci = _ci + 3;
        }
        arith_encode(cinfo,(uchar *)(_ci + 1),1);
        if (m < 1) {
          m = -m;
          arith_encode(cinfo,(uchar *)(pjVar2 + 0xf),1);
        }
        else {
          arith_encode(cinfo,(uchar *)(pjVar2 + 0xf),0);
        }
        _ci = _ci + 2;
        natural_order._0_4_ = 0;
        uVar6 = m - 1;
        if (uVar6 != 0) {
          arith_encode(cinfo,(uchar *)_ci,1);
          natural_order._0_4_ = 1;
          natural_order._4_4_ = (int)uVar6 >> 1;
          if (natural_order._4_4_ != 0) {
            arith_encode(cinfo,(uchar *)_ci,1);
            natural_order._0_4_ = 2;
            iVar7 = 0xd9;
            if (v <= (int)(uint)cinfo->arith_ac_K[iVar1]) {
              iVar7 = 0xbd;
            }
            _ci = (&pjVar2[9].finish_pass)[iVar1] + iVar7;
            while (natural_order._4_4_ = (int)natural_order._4_4_ >> 1, natural_order._4_4_ != 0) {
              arith_encode(cinfo,(uchar *)_ci,1);
              natural_order._0_4_ = (uint)natural_order << 1;
              _ci = _ci + 1;
            }
          }
        }
        arith_encode(cinfo,(uchar *)_ci,0);
        while (natural_order._0_4_ = (int)(uint)natural_order >> 1, (uint)natural_order != 0) {
          arith_encode(cinfo,(uchar *)(_ci + 0xe),(uint)(((uint)natural_order & uVar6) != 0));
        }
      }
      if (v < cinfo->lim_Se) {
        arith_encode(cinfo,(uchar *)((&pjVar2[9].finish_pass)[iVar1] + v * 3),1);
      }
    }
    tbl = tbl + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
encode_mcu (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, k, ke;
  int v, v2, m;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = (*block)[0] - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;	/* zero diff category */
    } else {
      entropy->last_dc_val[ci] = (*block)[0];
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
	arith_encode(cinfo, st + 1, 0);	/* Table F.4: SS = S0 + 1 */
	st += 2;			/* Table F.4: SP = S0 + 2 */
	entropy->dc_context[ci] = 4;	/* small positive diff category */
      } else {
	v = -v;
	arith_encode(cinfo, st + 1, 1);	/* Table F.4: SS = S0 + 1 */
	st += 3;			/* Table F.4: SN = S0 + 3 */
	entropy->dc_context[ci] = 8;	/* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
	arith_encode(cinfo, st, 1);
	m = 1;
	v2 = v;
	st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
	while (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st += 1;
	}
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;	/* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] += 8;	/* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }

    /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

    if ((ke = cinfo->lim_Se) == 0) continue;
    tbl = compptr->ac_tbl_no;

    /* Establish EOB (end-of-block) index */
    do {
      if ((*block)[natural_order[ke]]) break;
    } while (--ke);

    /* Figure F.5: Encode_AC_Coefficients */
    for (k = 0; k < ke;) {
      st = entropy->ac_stats[tbl] + 3 * k;
      arith_encode(cinfo, st, 0);	/* EOB decision */
      while ((v = (*block)[natural_order[++k]]) == 0) {
	arith_encode(cinfo, st + 1, 0);
	st += 3;
      }
      arith_encode(cinfo, st + 1, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
	arith_encode(cinfo, entropy->fixed_bin, 0);
      } else {
	v = -v;
	arith_encode(cinfo, entropy->fixed_bin, 1);
      }
      st += 2;
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
	arith_encode(cinfo, st, 1);
	m = 1;
	v2 = v;
	if (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (v2 >>= 1) {
	    arith_encode(cinfo, st, 1);
	    m <<= 1;
	    st += 1;
	  }
	}
      }
      arith_encode(cinfo, st, 0);
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
    /* Encode EOB decision only if k < cinfo->lim_Se */
    if (k < cinfo->lim_Se) {
      st = entropy->ac_stats[tbl] + 3 * k;
      arith_encode(cinfo, st, 1);
    }
  }

  return TRUE;
}